

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_catalog(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing catalog : 27 of 36 functions ...\n");
  }
  iVar1 = test_xmlACatalogAdd();
  iVar2 = test_xmlACatalogDump();
  iVar3 = test_xmlACatalogRemove();
  iVar4 = test_xmlACatalogResolve();
  iVar5 = test_xmlACatalogResolvePublic();
  iVar6 = test_xmlACatalogResolveSystem();
  iVar7 = test_xmlACatalogResolveURI();
  iVar8 = test_xmlCatalogAdd();
  iVar9 = test_xmlCatalogCleanup();
  iVar10 = test_xmlCatalogConvert();
  iVar11 = test_xmlCatalogDump();
  iVar12 = test_xmlCatalogGetDefaults();
  iVar13 = test_xmlCatalogIsEmpty();
  iVar14 = test_xmlCatalogLocalResolve();
  iVar15 = test_xmlCatalogLocalResolveURI();
  iVar16 = test_xmlCatalogRemove();
  iVar17 = test_xmlCatalogResolve();
  iVar18 = test_xmlCatalogResolvePublic();
  iVar19 = test_xmlCatalogResolveSystem();
  iVar20 = test_xmlCatalogResolveURI();
  iVar21 = test_xmlCatalogSetDefaultPrefer();
  iVar22 = test_xmlCatalogSetDefaults();
  iVar23 = test_xmlConvertSGMLCatalog();
  iVar24 = test_xmlInitializeCatalog();
  iVar25 = test_xmlLoadACatalog();
  iVar26 = test_xmlLoadCatalog();
  iVar27 = test_xmlLoadCatalogs();
  iVar28 = test_xmlLoadSGMLSuperCatalog();
  iVar29 = test_xmlNewCatalog();
  iVar30 = test_xmlParseCatalogFile();
  uVar31 = iVar30 + iVar29 + iVar28 + iVar27 + iVar26 + iVar25 + iVar24 + iVar23 + iVar22 + iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar31 != 0) {
    printf("Module catalog: %d errors\n",(ulong)uVar31);
  }
  return uVar31;
}

Assistant:

static int
test_catalog(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing catalog : 27 of 36 functions ...\n");
    test_ret += test_xmlACatalogAdd();
    test_ret += test_xmlACatalogDump();
    test_ret += test_xmlACatalogRemove();
    test_ret += test_xmlACatalogResolve();
    test_ret += test_xmlACatalogResolvePublic();
    test_ret += test_xmlACatalogResolveSystem();
    test_ret += test_xmlACatalogResolveURI();
    test_ret += test_xmlCatalogAdd();
    test_ret += test_xmlCatalogCleanup();
    test_ret += test_xmlCatalogConvert();
    test_ret += test_xmlCatalogDump();
    test_ret += test_xmlCatalogGetDefaults();
    test_ret += test_xmlCatalogIsEmpty();
    test_ret += test_xmlCatalogLocalResolve();
    test_ret += test_xmlCatalogLocalResolveURI();
    test_ret += test_xmlCatalogRemove();
    test_ret += test_xmlCatalogResolve();
    test_ret += test_xmlCatalogResolvePublic();
    test_ret += test_xmlCatalogResolveSystem();
    test_ret += test_xmlCatalogResolveURI();
    test_ret += test_xmlCatalogSetDefaultPrefer();
    test_ret += test_xmlCatalogSetDefaults();
    test_ret += test_xmlConvertSGMLCatalog();
    test_ret += test_xmlInitializeCatalog();
    test_ret += test_xmlLoadACatalog();
    test_ret += test_xmlLoadCatalog();
    test_ret += test_xmlLoadCatalogs();
    test_ret += test_xmlLoadSGMLSuperCatalog();
    test_ret += test_xmlNewCatalog();
    test_ret += test_xmlParseCatalogFile();

    if (test_ret != 0)
	printf("Module catalog: %d errors\n", test_ret);
    return(test_ret);
}